

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad_gl.c
# Opt level: O0

int glad_gl_has_extension(int version,char *exts,uint num_exts_i,char **exts_i,char *ext)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *e;
  uint index;
  char *terminator;
  char *loc;
  char *extensions;
  char *ext_local;
  char **exts_i_local;
  uint num_exts_i_local;
  char *exts_local;
  int version_local;
  
  if (version / 10000 < 3) {
    if ((exts == (char *)0x0) || (loc = exts, ext == (char *)0x0)) {
      exts_local._4_4_ = 0;
    }
    else {
      do {
        pcVar2 = strstr(loc,ext);
        if (pcVar2 == (char *)0x0) {
          return 0;
        }
        sVar3 = strlen(ext);
        pcVar4 = pcVar2 + sVar3;
      } while (((pcVar2 != loc) && (loc = pcVar4, pcVar2[-1] != ' ')) ||
              ((*pcVar4 != ' ' && (loc = pcVar4, *pcVar4 != '\0'))));
      exts_local._4_4_ = 1;
    }
  }
  else {
    for (e._4_4_ = 0; e._4_4_ < num_exts_i; e._4_4_ = e._4_4_ + 1) {
      iVar1 = strcmp(exts_i[e._4_4_],ext);
      if (iVar1 == 0) {
        return 1;
      }
    }
    exts_local._4_4_ = 0;
  }
  return exts_local._4_4_;
}

Assistant:

static int glad_gl_has_extension(int version, const char *exts, unsigned int num_exts_i, char **exts_i, const char *ext) {
    if(GLAD_VERSION_MAJOR(version) < 3 || !GLAD_GL_IS_SOME_NEW_VERSION) {
        const char *extensions;
        const char *loc;
        const char *terminator;
        extensions = exts;
        if(extensions == NULL || ext == NULL) {
            return 0;
        }
        while(1) {
            loc = strstr(extensions, ext);
            if(loc == NULL) {
                return 0;
            }
            terminator = loc + strlen(ext);
            if((loc == extensions || *(loc - 1) == ' ') &&
                (*terminator == ' ' || *terminator == '\0')) {
                return 1;
            }
            extensions = terminator;
        }
    } else {
        unsigned int index;
        for(index = 0; index < num_exts_i; index++) {
            const char *e = exts_i[index];
            if(strcmp(e, ext) == 0) {
                return 1;
            }
        }
    }
    return 0;
}